

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_equals_different_Test::TestBody
          (WelcomeMessageTest_test_equals_different_Test *this)

{
  char *pcVar1;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [3];
  
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_28,VERSION + 1,CLIENT_ID,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)&gtest_ar,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID)",(WelcomeMessage *)WELCOME_MESSAGE,
             (WelcomeMessage *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_28,VERSION,CLIENT_ID + 1,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)&gtest_ar,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID)",(WelcomeMessage *)WELCOME_MESSAGE,
             (WelcomeMessage *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_28,VERSION,CLIENT_ID,SERVER_ID + 1);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)&gtest_ar,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1)",(WelcomeMessage *)WELCOME_MESSAGE,
             (WelcomeMessage *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_equals_different)
{
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1));
}